

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

ON_Mesh * __thiscall ON_MeshRef::SetMeshForExperts(ON_MeshRef *this,ON_Mesh **mesh)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ON_Mesh *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  p_Var1 = (this->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  __p = *mesh;
  if (*mesh == &ON_Mesh::Empty) {
    __p = (ON_Mesh *)0x0;
  }
  *mesh = (ON_Mesh *)0x0;
  if (__p != (ON_Mesh *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ON_Mesh*>(&_Stack_20,__p);
    _Var2._M_pi = _Stack_20._M_pi;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
    (this->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  return __p;
}

Assistant:

class ON_Mesh* ON_MeshRef::SetMeshForExperts(
  class ON_Mesh*& mesh
  )
{
  Clear();
  ON_Mesh* managed_mesh = ( mesh == &ON_Mesh::Empty ) ? nullptr : mesh;
  mesh = nullptr;
  if (nullptr != managed_mesh )
    m_mesh_sp = std::shared_ptr<class ON_Mesh>(managed_mesh);
  return managed_mesh;
}